

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form3_Minimum(MinimumForm3 Minimum)

{
  uint8_t value;
  bool bVar1;
  byte value_00;
  pointer puVar2;
  uint32_t roiHeight;
  uint32_t roiWidth;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  Image output;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roiY;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  
  Unit_Test::intensityArray(&intensity,2);
  input.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  input.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar2 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      value = *puVar2;
      PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
                ((ImageTemplate<unsigned_char> *)&roiX,0,0,'\x01','\x01');
      Test_Helper::uniformImage(&output,value,0,0,(ImageTemplate<unsigned_char> *)&roiX);
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
      ::emplace_back<PenguinV_Image::ImageTemplate<unsigned_char>>
                ((vector<PenguinV_Image::ImageTemplate<unsigned_char>,std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>>>
                  *)&input,&output);
      output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
      roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&PTR__ImageTemplate_00215948;
      PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)&roiX);
      puVar2 = puVar2 + 1;
    } while (puVar2 != intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Unit_Test::generateRoi(&input,&roiX,&roiY,&roiWidth,&roiHeight);
  (*Minimum)(&output,input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             *roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             *roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start,
             input.
             super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1,
             roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],
             roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[1],roiWidth,roiHeight);
  bVar1 = Unit_Test::equalSize(&output,roiWidth,roiHeight);
  if (bVar1) {
    value_00 = intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[1];
    if (*intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start <
        intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[1]) {
      value_00 = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    }
    bVar1 = Unit_Test::verifyImage(&output,value_00);
  }
  else {
    bVar1 = false;
  }
  output._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&output);
  if (roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiY.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(roiX.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  if (intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form3_Minimum(MinimumForm3 Minimum)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input;

        std::for_each( intensity.begin(), intensity.end(), [&]( uint8_t value )
        { input.push_back( uniformImage( value ) ); } );

        std::vector < uint32_t > roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = Minimum( input[0], roiX[0], roiY[0], input[1], roiX[1], roiY[1], roiWidth, roiHeight );

        return equalSize( output, roiWidth, roiHeight ) &&
            verifyImage( output, intensity[0] < intensity[1] ? intensity[0] : intensity[1] );
    }